

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_KillSiblings
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int selector;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  AActor *source;
  AActor *inflictor;
  AActor *pAVar4;
  AActor *pAVar5;
  AActor *pAVar6;
  AActor *origin;
  char *pcVar7;
  PClassActor *filter;
  bool bVar8;
  TThinkerIterator<AActor> it;
  int local_5c;
  int local_58;
  int local_54;
  FName local_50;
  FName local_4c;
  FThinkerIterator local_48;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
    goto LAB_003e184f;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e1820:
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e184f:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x17fa,
                  "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  origin = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (origin == (AActor *)0x0) goto LAB_003e15b6;
    pPVar3 = (origin->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (origin->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar8 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar8) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar8 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar8) {
      pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e184f;
    }
  }
  else {
    if (origin != (AActor *)0x0) goto LAB_003e1820;
LAB_003e15b6:
    origin = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e18dd:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x17fb,
                    "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_54 = param[1].field_0.i;
LAB_003e1617:
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e18fc:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x17fc,
                    "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_58 = param[2].field_0.i;
LAB_003e162a:
    if (param[3].field_0.field_3.Type != '\x03') {
LAB_003e1829:
      pcVar7 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003e1830:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x17fd,
                    "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    filter = (PClassActor *)param[3].field_0.field_1.a;
    if (param[3].field_0.field_1.atag != 1) {
      if (filter != (PClassActor *)0x0) goto LAB_003e1829;
      filter = (PClassActor *)0x0;
    }
LAB_003e164c:
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e18ac:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x17fe,
                    "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_5c = param[4].field_0.i;
LAB_003e165f:
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e188d:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x17ff,
                    "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar2 = param[5].field_0.i;
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar7 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e18dd;
    }
    local_54 = param[1].field_0.i;
    if (numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003e1617;
    }
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar7 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e18fc;
    }
    local_58 = param[2].field_0.i;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003e162a;
    }
    if ((param[3].field_0.field_3.Type != '\x03') ||
       (filter = (PClassActor *)param[3].field_0.field_1.a,
       filter != (PClassActor *)0x0 && param[3].field_0.field_1.atag != 1)) {
      pcVar7 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003e1830;
    }
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003e164c;
    }
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar7 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e18ac;
    }
    local_5c = param[4].field_0.i;
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003e165f;
    }
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar7 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e188d;
    }
    iVar2 = param[5].field_0.i;
    if (6 < (uint)numparam) {
      if (param[6].field_0.field_3.Type != '\0') {
        pcVar7 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003e186e;
      }
      goto LAB_003e1679;
    }
    param = defaultparam->Array;
  }
  if (param[6].field_0.field_3.Type != '\0') {
    pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e186e:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1800,
                  "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003e1679:
  selector = param[6].field_0.i;
  source = COPY_AAPTR(origin,iVar2);
  inflictor = COPY_AAPTR(origin,selector);
  FThinkerIterator::FThinkerIterator(&local_48,AActor::RegistrationInfo.MyClass,0x80);
  pAVar4 = (origin->master).field_0.p;
  if (pAVar4 != (AActor *)0x0) {
    if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      pAVar4 = (AActor *)FThinkerIterator::Next(&local_48,false);
      if (pAVar4 != (AActor *)0x0) {
        do {
          pAVar5 = (origin->master).field_0.p;
          if (pAVar5 == (AActor *)0x0) {
LAB_003e1704:
            pAVar5 = (AActor *)0x0;
          }
          else if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
            (origin->master).field_0.p = (AActor *)0x0;
            goto LAB_003e1704;
          }
          pAVar6 = (pAVar4->master).field_0.p;
          if (pAVar6 == (AActor *)0x0) {
LAB_003e1723:
            pAVar6 = (AActor *)0x0;
          }
          else if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
            (pAVar4->master).field_0.p = (AActor *)0x0;
            goto LAB_003e1723;
          }
          if (pAVar4 != origin && pAVar6 == pAVar5) {
            local_4c.Index = local_54;
            local_50.Index = local_5c;
            DoKill(pAVar4,inflictor,source,&local_4c,local_58,filter,&local_50);
          }
          pAVar4 = (AActor *)FThinkerIterator::Next(&local_48,false);
        } while (pAVar4 != (AActor *)0x0);
      }
    }
    else {
      (origin->master).field_0.p = (AActor *)0x0;
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_KillSiblings)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_NAME_DEF	(damagetype)	
	PARAM_INT_DEF	(flags)			
	PARAM_CLASS_DEF	(filter, AActor)
	PARAM_NAME_DEF	(species)		
	PARAM_INT_DEF	(src)			
	PARAM_INT_DEF	(inflict)		

	AActor *source = COPY_AAPTR(self, src);
	AActor *inflictor = COPY_AAPTR(self, inflict);

	TThinkerIterator<AActor> it;
	AActor *mo;

	if (self->master != NULL)
	{
		while ( (mo = it.Next()) )
		{
			if (mo->master == self->master && mo != self)
			{ 
				DoKill(mo, inflictor, source, damagetype, flags, filter, species);
			}
		}
	}
	return 0;
}